

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O1

string * __thiscall Klex::parseOutSymbol_abi_cxx11_(string *__return_storage_ptr__,Klex *this)

{
  int iVar1;
  long lVar2;
  string equSecondSymbols;
  string equFirstSymbols;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"=","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"!><+-*/%^","");
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  iVar1 = this->currentChar;
  if (iVar1 == 0x3d) {
    nextChar(this);
    lVar2 = std::__cxx11::string::find((char)local_50,(ulong)(uint)(int)(char)this->currentChar);
    if (lVar2 == -1) goto LAB_0010b81c;
  }
  else if (iVar1 == 0x3c) {
    nextChar(this);
    if (this->currentChar != 0x2d) goto LAB_0010b81c;
  }
  else {
    lVar2 = std::__cxx11::string::find((char)local_70,(ulong)(uint)(int)(char)iVar1);
    nextChar(this);
    if ((lVar2 == -1) || (this->currentChar != 0x3d)) goto LAB_0010b81c;
  }
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  nextChar(this);
LAB_0010b81c:
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Klex::parseOutSymbol() {
    std::string lexeme;

    std::string equFirstSymbols = "=";
    std::string equSecondSymbols = "!><+-*/%^";

    lexeme.push_back(getChar());

    if(getChar() == '<')  {
        nextChar();
        if(getChar() == '-') {
            lexeme.push_back(getChar());
            nextChar();
        }
    } else if(getChar() == '=') {
        nextChar();
        if(equFirstSymbols.find(getChar()) != -1) {
            lexeme.push_back(getChar());
            nextChar();
        }
    } else if(equSecondSymbols.find(getChar()) != -1) {
        nextChar();
        if(getChar() == '=') {
            lexeme.push_back(getChar());
            nextChar();
        }
    } else {
        nextChar();
    }

    return lexeme;
}